

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Uint32 anon_unknown.dwarf_3ae181::RenderTargetImpl::equationToGlConstant(Equation blendEquation)

{
  ostream *poVar1;
  undefined4 in_EDI;
  
  switch(in_EDI) {
  case 0:
    return 0x8006;
  case 1:
    if (SF_GLAD_GL_EXT_blend_subtract != 0) {
      return 0x800a;
    }
    break;
  case 2:
    if (SF_GLAD_GL_EXT_blend_subtract != 0) {
      return 0x800b;
    }
    break;
  case 3:
    if (SF_GLAD_GL_EXT_blend_minmax != 0) {
      return 0x8007;
    }
    break;
  case 4:
    if (SF_GLAD_GL_EXT_blend_minmax != 0) {
      return 0x8008;
    }
  }
  if (!equationToGlConstant::warned) {
    poVar1 = sf::err();
    poVar1 = std::operator<<(poVar1,
                             "OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = sf::err();
    poVar1 = std::operator<<(poVar1,"Some blending equations will fallback to sf::BlendMode::Add");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = sf::err();
    poVar1 = std::operator<<(poVar1,"Ensure that hardware acceleration is enabled if available");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    equationToGlConstant::warned = true;
  }
  return 0x8006;
}

Assistant:

sf::Uint32 equationToGlConstant(sf::BlendMode::Equation blendEquation)
        {
            switch (blendEquation)
            {
                case sf::BlendMode::Add:
                    return GLEXT_GL_FUNC_ADD;
                case sf::BlendMode::Subtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_SUBTRACT;
                    break;
                case sf::BlendMode::ReverseSubtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_REVERSE_SUBTRACT;
                    break;
                case sf::BlendMode::Min:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MIN;
                    break;
                case sf::BlendMode::Max:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MAX;
                    break;
            }

            static bool warned = false;
            if (!warned)
            {
                sf::err() << "OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable" << std::endl;
                sf::err() << "Some blending equations will fallback to sf::BlendMode::Add" << std::endl;
                sf::err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                warned = true;
            }

            return GLEXT_GL_FUNC_ADD;
        }